

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cpp
# Opt level: O2

Object * __thiscall
Lodtalk::Behavior::basicNativeNew(Behavior *this,VMContext *context,size_t indexableSize)

{
  SmallIntegerValue SVar1;
  size_t fixedSlotCount;
  ObjectHeader *pOVar2;
  
  SVar1 = Oop::decodeSmallInteger(&this->format);
  fixedSlotCount = Oop::decodeSmallInteger(&this->fixedVariableCount);
  pOVar2 = VMContext::newObject
                     (context,fixedSlotCount,indexableSize,(ObjectFormat)SVar1,
                      *(uint *)&(this->super_Object).super_ProtoObject.object_header_ >> 10,-1);
  return (Object *)pOVar2;
}

Assistant:

Object *Behavior::basicNativeNew(VMContext *context, size_t indexableSize)
{
	auto theFormat = (ObjectFormat)format.decodeSmallInteger();
	auto fixedSlotCount = fixedVariableCount.decodeSmallInteger();
	auto classIndex = object_header_.identityHash;
	return reinterpret_cast<Object*> (context->newObject(fixedSlotCount, indexableSize, theFormat, classIndex));
}